

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rect.h
# Opt level: O3

bool __thiscall DisjointRectCollection::Disjoint(DisjointRectCollection *this,Rect *r)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  
  bVar1 = true;
  if (((r->width != 0) && (r->height != 0)) && ((this->rects).Count != 0)) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      bVar1 = Disjoint((Rect *)((long)&((this->rects).Array)->x + lVar3),r);
      if (!bVar1) {
        return bVar1;
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 < (this->rects).Count);
  }
  return bVar1;
}

Assistant:

bool Disjoint(const Rect &r) const
	{
		// Degenerate rectangles are ignored.
		if (r.width == 0 || r.height == 0)
			return true;

		for(unsigned i = 0; i < rects.Size(); ++i)
			if (!Disjoint(rects[i], r))
				return false;
		return true;
	}